

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O3

string * __thiscall
cmExtraCodeBlocksGenerator::GetCBCompilerId_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  cmGlobalGenerator *pcVar4;
  bool bVar5;
  int iVar6;
  string *psVar7;
  char *pcVar8;
  char *pcVar9;
  string compilerIdVar;
  string local_98;
  string local_78;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"CMAKE_CODEBLOCKS_COMPILER_ID","");
  psVar7 = cmMakefile::GetSafeDefinition(mf,&local_78);
  pcVar3 = (psVar7->_M_dataplus)._M_p;
  local_58 = &local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,pcVar3 + psVar7->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  if (local_50 != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_58 == &local_48) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_48;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_40;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_48;
    }
    __return_storage_ptr__->_M_string_length = local_50;
    return __return_storage_ptr__;
  }
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  pcVar4 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  paVar2 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"CXX","");
  bVar5 = cmGlobalGenerator::GetLanguageEnabled(pcVar4,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    pcVar8 = "CMAKE_CXX_COMPILER_ID";
LAB_00281aff:
    bVar5 = false;
    std::__cxx11::string::_M_replace
              ((ulong)&local_78,0,(char *)local_78._M_string_length,(ulong)pcVar8);
  }
  else {
    pcVar4 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"C","");
    bVar5 = cmGlobalGenerator::GetLanguageEnabled(pcVar4,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (bVar5) {
      pcVar8 = "CMAKE_C_COMPILER_ID";
      goto LAB_00281aff;
    }
    pcVar4 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Fortran","");
    bVar5 = cmGlobalGenerator::GetLanguageEnabled(pcVar4,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (bVar5) {
      bVar5 = true;
      std::__cxx11::string::_M_replace
                ((ulong)&local_78,0,(char *)local_78._M_string_length,0x4bdecf);
    }
    else {
      bVar5 = false;
    }
  }
  psVar7 = cmMakefile::GetSafeDefinition(mf,&local_78);
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  pcVar8 = "gcc";
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"gcc","");
  iVar6 = std::__cxx11::string::compare((char *)psVar7);
  if (iVar6 == 0) {
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"MSVC10","");
    bVar5 = cmMakefile::IsDefinitionSet(mf,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    pcVar9 = "msvc8";
    if (bVar5) {
      pcVar9 = "msvc10";
    }
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)psVar7);
    if (iVar6 == 0) {
      pcVar9 = "bcc";
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)psVar7);
      if (iVar6 != 0) {
        iVar6 = std::__cxx11::string::compare((char *)psVar7);
        if (iVar6 == 0) {
          if (bVar5) {
            local_98._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"WIN32","");
            bVar5 = cmMakefile::IsDefinitionSet(mf,&local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != paVar2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            if (bVar5) {
              pcVar8 = "ifcwin";
              goto LAB_00281dee;
            }
          }
          pcVar8 = "icc";
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)psVar7);
          pcVar9 = "ow";
          if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)psVar7), iVar6 == 0))
          goto LAB_00281d20;
          iVar6 = std::__cxx11::string::compare((char *)psVar7);
          if (iVar6 == 0) {
            pcVar8 = "clang";
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)psVar7);
            if (iVar6 == 0) {
              pcVar9 = "pgifortran";
              pcVar8 = "pgi";
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)psVar7);
              if (iVar6 != 0) goto LAB_00281d3e;
              pcVar9 = "gfortran";
            }
            if (bVar5) {
              pcVar8 = pcVar9;
            }
          }
        }
LAB_00281dee:
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar8);
        goto LAB_00281d3e;
      }
      pcVar9 = "sdcc";
    }
  }
LAB_00281d20:
  std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             (ulong)pcVar9);
LAB_00281d3e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::GetCBCompilerId(const cmMakefile* mf)
{
  // allow the user to overwrite the detected compiler
  std::string userCompiler =
    mf->GetSafeDefinition("CMAKE_CODEBLOCKS_COMPILER_ID");
  if (!userCompiler.empty()) {
    return userCompiler;
  }

  // figure out which language to use
  // for now care only for C, C++, and Fortran

  // projects with C/C++ and Fortran are handled as C/C++ projects
  bool pureFortran = false;
  std::string compilerIdVar;
  if (this->GlobalGenerator->GetLanguageEnabled("CXX")) {
    compilerIdVar = "CMAKE_CXX_COMPILER_ID";
  } else if (this->GlobalGenerator->GetLanguageEnabled("C")) {
    compilerIdVar = "CMAKE_C_COMPILER_ID";
  } else if (this->GlobalGenerator->GetLanguageEnabled("Fortran")) {
    compilerIdVar = "CMAKE_Fortran_COMPILER_ID";
    pureFortran = true;
  }

  std::string const& compilerId = mf->GetSafeDefinition(compilerIdVar);
  std::string compiler = "gcc"; // default to gcc
  if (compilerId == "MSVC") {
    if (mf->IsDefinitionSet("MSVC10")) {
      compiler = "msvc10";
    } else {
      compiler = "msvc8";
    }
  } else if (compilerId == "Borland") {
    compiler = "bcc";
  } else if (compilerId == "SDCC") {
    compiler = "sdcc";
  } else if (compilerId == "Intel") {
    if (pureFortran && mf->IsDefinitionSet("WIN32")) {
      compiler = "ifcwin"; // Intel Fortran for Windows (known by cbFortran)
    } else {
      compiler = "icc";
    }
  } else if (compilerId == "Watcom" || compilerId == "OpenWatcom") {
    compiler = "ow";
  } else if (compilerId == "Clang") {
    compiler = "clang";
  } else if (compilerId == "PGI") {
    if (pureFortran) {
      compiler = "pgifortran";
    } else {
      compiler = "pgi"; // does not exist as default in CodeBlocks 16.01
    }
  } else if (compilerId == "GNU") {
    if (pureFortran) {
      compiler = "gfortran";
    } else {
      compiler = "gcc";
    }
  }
  return compiler;
}